

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O3

void md5_process(md5_state_t *pms,md5_byte_t *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  
  uVar1 = pms->abcd[1];
  uVar2 = pms->abcd[2];
  uVar3 = pms->abcd[3];
  iVar4 = *(int *)data;
  iVar5 = *(int *)(data + 4);
  iVar6 = *(int *)(data + 8);
  uVar20 = ((uVar2 ^ uVar3) & uVar1 ^ uVar3) + pms->abcd[0] + iVar4 + 0xd76aa478;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar1;
  uVar21 = ((uVar1 ^ uVar2) & uVar20 ^ uVar2) + uVar3 + iVar5 + 0xe8c7b756;
  uVar21 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  uVar22 = ((uVar20 ^ uVar1) & uVar21 ^ uVar1) + uVar2 + iVar6 + 0x242070db;
  iVar7 = *(int *)(data + 0xc);
  uVar22 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar21;
  uVar23 = ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + iVar7 + uVar1 + 0xc1bdceee;
  uVar23 = (uVar23 * 0x400000 | uVar23 >> 10) + uVar22;
  iVar8 = *(int *)(data + 0x10);
  uVar20 = uVar20 + iVar8 + ((uVar22 ^ uVar21) & uVar23 ^ uVar21) + 0xf57c0faf;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar23;
  iVar9 = *(int *)(data + 0x14);
  uVar21 = uVar21 + iVar9 + ((uVar23 ^ uVar22) & uVar20 ^ uVar22) + 0x4787c62a;
  uVar21 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  iVar10 = *(int *)(data + 0x18);
  uVar22 = uVar22 + iVar10 + ((uVar20 ^ uVar23) & uVar21 ^ uVar23) + 0xa8304613;
  uVar22 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar21;
  iVar11 = *(int *)(data + 0x1c);
  uVar23 = uVar23 + iVar11 + ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + 0xfd469501;
  uVar24 = (uVar23 * 0x400000 | uVar23 >> 10) + uVar22;
  iVar12 = *(int *)(data + 0x20);
  uVar20 = ((uVar22 ^ uVar21) & uVar24 ^ uVar21) + uVar20 + iVar12 + 0x698098d8;
  uVar25 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar24;
  iVar13 = *(int *)(data + 0x24);
  uVar20 = uVar21 + iVar13 + ((uVar24 ^ uVar22) & uVar25 ^ uVar22) + 0x8b44f7af;
  uVar21 = (uVar20 * 0x1000 | uVar20 >> 0x14) + uVar25;
  iVar14 = *(int *)(data + 0x28);
  uVar20 = (uVar22 + iVar14 + ((uVar25 ^ uVar24) & uVar21 ^ uVar24)) - 0xa44f;
  uVar23 = (uVar20 * 0x20000 | uVar20 >> 0xf) + uVar21;
  iVar15 = *(int *)(data + 0x2c);
  uVar20 = ((uVar21 ^ uVar25) & uVar23 ^ uVar25) + uVar24 + iVar15 + 0x895cd7be;
  uVar24 = (uVar20 * 0x400000 | uVar20 >> 10) + uVar23;
  iVar16 = *(int *)(data + 0x30);
  uVar20 = ((uVar23 ^ uVar21) & uVar24 ^ uVar21) + uVar25 + iVar16 + 0x6b901122;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar24;
  iVar17 = *(int *)(data + 0x34);
  uVar21 = uVar21 + iVar17 + ((uVar24 ^ uVar23) & uVar20 ^ uVar23) + 0xfd987193;
  uVar22 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  iVar18 = *(int *)(data + 0x38);
  uVar21 = uVar23 + iVar18 + (uVar24 & ~uVar22 | uVar22 & uVar20) + 0xa679438e;
  uVar23 = (uVar21 * 0x20000 | uVar21 >> 0xf) + uVar22;
  iVar19 = *(int *)(data + 0x3c);
  uVar21 = (uVar20 & ~uVar23 | uVar23 & uVar22) + uVar24 + iVar19 + 0x49b40821;
  uVar21 = (uVar21 * 0x400000 | uVar21 >> 10) + uVar23;
  uVar20 = (~uVar22 & uVar23 | uVar21 & uVar22) + iVar5 + uVar20 + 0xf61e2562;
  uVar24 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar21;
  uVar20 = uVar22 + iVar10 + (~uVar23 & uVar21 | uVar24 & uVar23) + 0xc040b340;
  uVar22 = (uVar20 * 0x200 | uVar20 >> 0x17) + uVar24;
  uVar20 = uVar23 + iVar15 + ((uVar22 ^ uVar24) & uVar21 ^ uVar24) + 0x265e5a51;
  uVar23 = (uVar20 * 0x4000 | uVar20 >> 0x12) + uVar22;
  uVar20 = uVar21 + iVar4 + ((uVar23 ^ uVar22) & uVar24 ^ uVar22) + 0xe9b6c7aa;
  uVar20 = (uVar20 * 0x100000 | uVar20 >> 0xc) + uVar23;
  uVar21 = uVar24 + iVar9 + ((uVar20 ^ uVar23) & uVar22 ^ uVar23) + 0xd62f105d;
  uVar24 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar20;
  uVar21 = uVar22 + iVar14 + ((uVar24 ^ uVar20) & uVar23 ^ uVar20) + 0x2441453;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar24;
  uVar22 = uVar23 + iVar19 + ((uVar21 ^ uVar24) & uVar20 ^ uVar24) + 0xd8a1e681;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar20 = uVar20 + iVar8 + ((uVar22 ^ uVar21) & uVar24 ^ uVar21) + 0xe7d3fbc8;
  uVar20 = (uVar20 * 0x100000 | uVar20 >> 0xc) + uVar22;
  uVar23 = uVar24 + iVar13 + ((uVar20 ^ uVar22) & uVar21 ^ uVar22) + 0x21e1cde6;
  uVar23 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar20;
  uVar21 = uVar21 + iVar18 + ((uVar23 ^ uVar20) & uVar22 ^ uVar20) + 0xc33707d6;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar23;
  uVar22 = uVar22 + iVar7 + ((uVar21 ^ uVar23) & uVar20 ^ uVar23) + 0xf4d50d87;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar20 = uVar20 + iVar12 + ((uVar22 ^ uVar21) & uVar23 ^ uVar21) + 0x455a14ed;
  uVar20 = (uVar20 * 0x100000 | uVar20 >> 0xc) + uVar22;
  uVar23 = uVar23 + iVar17 + ((uVar20 ^ uVar22) & uVar21 ^ uVar22) + 0xa9e3e905;
  uVar23 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar20;
  uVar21 = uVar21 + iVar6 + ((uVar23 ^ uVar20) & uVar22 ^ uVar20) + 0xfcefa3f8;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar23;
  uVar22 = ((uVar21 ^ uVar23) & uVar20 ^ uVar23) + uVar22 + iVar11 + 0x676f02d9;
  uVar24 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar20 = ((uVar24 ^ uVar21) & uVar23 ^ uVar21) + uVar20 + iVar16 + 0x8d2a4c8a;
  uVar22 = (uVar20 * 0x100000 | uVar20 >> 0xc) + uVar24;
  uVar20 = (uVar23 + iVar9 + (uVar22 ^ uVar24 ^ uVar21)) - 0x5c6be;
  uVar23 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar22;
  uVar20 = (uVar22 ^ uVar24 ^ uVar23) + uVar21 + iVar12 + 0x8771f681;
  uVar20 = (uVar20 * 0x800 | uVar20 >> 0x15) + uVar23;
  uVar21 = (uVar23 ^ uVar22 ^ uVar20) + uVar24 + iVar15 + 0x6d9d6122;
  uVar21 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar20;
  uVar22 = uVar22 + iVar18 + (uVar20 ^ uVar23 ^ uVar21) + 0xfde5380c;
  uVar22 = (uVar22 * 0x800000 | uVar22 >> 9) + uVar21;
  uVar23 = uVar23 + iVar5 + (uVar21 ^ uVar20 ^ uVar22) + 0xa4beea44;
  uVar23 = (uVar23 * 0x10 | uVar23 >> 0x1c) + uVar22;
  uVar20 = uVar20 + iVar8 + (uVar22 ^ uVar21 ^ uVar23) + 0x4bdecfa9;
  uVar20 = (uVar20 * 0x800 | uVar20 >> 0x15) + uVar23;
  uVar21 = uVar21 + iVar11 + (uVar23 ^ uVar22 ^ uVar20) + 0xf6bb4b60;
  uVar21 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar20;
  uVar22 = uVar22 + iVar14 + (uVar20 ^ uVar23 ^ uVar21) + 0xbebfbc70;
  uVar22 = (uVar22 * 0x800000 | uVar22 >> 9) + uVar21;
  uVar23 = uVar23 + iVar17 + (uVar21 ^ uVar20 ^ uVar22) + 0x289b7ec6;
  uVar23 = (uVar23 * 0x10 | uVar23 >> 0x1c) + uVar22;
  uVar20 = uVar20 + iVar4 + (uVar22 ^ uVar21 ^ uVar23) + 0xeaa127fa;
  uVar20 = (uVar20 * 0x800 | uVar20 >> 0x15) + uVar23;
  uVar21 = uVar21 + iVar7 + (uVar23 ^ uVar22 ^ uVar20) + 0xd4ef3085;
  uVar21 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar20;
  uVar22 = uVar22 + iVar10 + (uVar20 ^ uVar23 ^ uVar21) + 0x4881d05;
  uVar22 = (uVar22 * 0x800000 | uVar22 >> 9) + uVar21;
  uVar23 = uVar23 + iVar13 + (uVar21 ^ uVar20 ^ uVar22) + 0xd9d4d039;
  uVar23 = (uVar23 * 0x10 | uVar23 >> 0x1c) + uVar22;
  uVar20 = uVar20 + iVar16 + (uVar22 ^ uVar21 ^ uVar23) + 0xe6db99e5;
  uVar20 = (uVar20 * 0x800 | uVar20 >> 0x15) + uVar23;
  uVar21 = uVar21 + iVar19 + (uVar23 ^ uVar22 ^ uVar20) + 0x1fa27cf8;
  uVar21 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar20;
  uVar22 = uVar22 + iVar6 + (uVar20 ^ uVar23 ^ uVar21) + 0xc4ac5665;
  uVar22 = (uVar22 * 0x800000 | uVar22 >> 9) + uVar21;
  uVar23 = ((~uVar20 | uVar22) ^ uVar21) + uVar23 + iVar4 + 0xf4292244;
  uVar23 = (uVar23 * 0x40 | uVar23 >> 0x1a) + uVar22;
  uVar20 = ((~uVar21 | uVar23) ^ uVar22) + uVar20 + iVar11 + 0x432aff97;
  uVar24 = (uVar20 * 0x400 | uVar20 >> 0x16) + uVar23;
  uVar20 = uVar21 + iVar18 + ((~uVar22 | uVar24) ^ uVar23) + 0xab9423a7;
  uVar21 = (uVar20 * 0x8000 | uVar20 >> 0x11) + uVar24;
  uVar20 = ((~uVar23 | uVar21) ^ uVar24) + uVar22 + iVar9 + 0xfc93a039;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar22 = ((~uVar24 | uVar20) ^ uVar21) + uVar23 + iVar16 + 0x655b59c3;
  uVar22 = (uVar22 * 0x40 | uVar22 >> 0x1a) + uVar20;
  uVar23 = uVar24 + iVar7 + ((~uVar21 | uVar22) ^ uVar20) + 0x8f0ccc92;
  uVar24 = (uVar23 * 0x400 | uVar23 >> 0x16) + uVar22;
  uVar21 = (uVar21 + iVar14 + ((~uVar20 | uVar24) ^ uVar22)) - 0x100b83;
  uVar21 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar24;
  uVar20 = uVar20 + iVar5 + ((~uVar22 | uVar21) ^ uVar24) + 0x85845dd1;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar22 = uVar22 + iVar12 + ((~uVar24 | uVar20) ^ uVar21) + 0x6fa87e4f;
  uVar23 = (uVar22 * 0x40 | uVar22 >> 0x1a) + uVar20;
  uVar22 = ((~uVar21 | uVar23) ^ uVar20) + uVar24 + iVar19 + 0xfe2ce6e0;
  uVar22 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar23;
  uVar21 = uVar21 + iVar10 + ((~uVar20 | uVar22) ^ uVar23) + 0xa3014314;
  uVar21 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar22;
  uVar20 = uVar20 + iVar17 + ((~uVar23 | uVar21) ^ uVar22) + 0x4e0811a1;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar23 = ((~uVar22 | uVar20) ^ uVar21) + uVar23 + iVar8 + 0xf7537e82;
  uVar23 = (uVar23 * 0x40 | uVar23 >> 0x1a) + uVar20;
  uVar22 = uVar22 + iVar15 + ((~uVar21 | uVar23) ^ uVar20) + 0xbd3af235;
  uVar22 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar23;
  uVar21 = uVar21 + iVar6 + ((~uVar20 | uVar22) ^ uVar23) + 0x2ad7d2bb;
  uVar21 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar22;
  uVar20 = uVar20 + iVar13 + ((~uVar23 | uVar21) ^ uVar22) + 0xeb86d391;
  pms->abcd[0] = uVar23 + pms->abcd[0];
  pms->abcd[1] = uVar1 + uVar21 + (uVar20 * 0x200000 | uVar20 >> 0xb);
  pms->abcd[2] = uVar21 + uVar2;
  pms->abcd[3] = uVar22 + uVar3;
  return;
}

Assistant:

static void
md5_process(md5_state_t *pms, const md5_byte_t *data /*[64]*/)
{
    md5_word_t
        a = pms->abcd[0], b = pms->abcd[1],
        c = pms->abcd[2], d = pms->abcd[3];
    md5_word_t t;
#if BYTE_ORDER > 0
    /* Define storage only for big-endian CPUs. */
    md5_word_t X[16];
#else
    /* Define storage for little-endian or both types of CPUs. */
    md5_word_t xbuf[16];
    const md5_word_t *X;
#endif

    {
#if BYTE_ORDER == 0
        /*
         * Determine dynamically whether this is a big-endian or
         * little-endian machine, since we can use a more efficient
         * algorithm on the latter.
         */
        static const int w = 1;

        if (*((const md5_byte_t *)&w)) /* dynamic little-endian */
#endif
#if BYTE_ORDER <= 0             /* little-endian */
        {
            /*
             * On little-endian machines, we can process properly aligned
             * data without copying it.
             */
            if (!((data - (const md5_byte_t *)0) & 3)) {
                /* data are properly aligned */
                X = (const md5_word_t *)data;
            } else {
                /* not aligned */
                memcpy(xbuf, data, 64);
                X = xbuf;
            }
        }
#endif
#if BYTE_ORDER == 0
        else                    /* dynamic big-endian */
#endif
#if BYTE_ORDER >= 0             /* big-endian */
        {
            /*
             * On big-endian machines, we must arrange the bytes in the
             * right order.
             */
            const md5_byte_t *xp = data;
            int i;

#  if BYTE_ORDER == 0
            X = xbuf;           /* (dynamic only) */
#  else
#    define xbuf X              /* (static only) */
#  endif
            for (i = 0; i < 16; ++i, xp += 4)
                xbuf[i] = xp[0] + (xp[1] << 8) + (xp[2] << 16) + (xp[3] << 24);
        }
#endif
    }

#define ROTATE_LEFT(x, n) (((x) << (n)) | ((x) >> (32 - (n))))

    /* Round 1. */
    /* Let [abcd k s i] denote the operation
       a = b + ((a + F(b,c,d) + X[k] + T[i]) <<< s). */
#define F(x, y, z) (((x) & (y)) | (~(x) & (z)))
#define SET(a, b, c, d, k, s, Ti)\
  t = a + F(b,c,d) + X[k] + Ti;\
  a = ROTATE_LEFT(t, s) + b
    /* Do the following 16 operations. */
    SET(a, b, c, d,  0,  7,  T1);
    SET(d, a, b, c,  1, 12,  T2);
    SET(c, d, a, b,  2, 17,  T3);
    SET(b, c, d, a,  3, 22,  T4);
    SET(a, b, c, d,  4,  7,  T5);
    SET(d, a, b, c,  5, 12,  T6);
    SET(c, d, a, b,  6, 17,  T7);
    SET(b, c, d, a,  7, 22,  T8);
    SET(a, b, c, d,  8,  7,  T9);
    SET(d, a, b, c,  9, 12, T10);
    SET(c, d, a, b, 10, 17, T11);
    SET(b, c, d, a, 11, 22, T12);
    SET(a, b, c, d, 12,  7, T13);
    SET(d, a, b, c, 13, 12, T14);
    SET(c, d, a, b, 14, 17, T15);
    SET(b, c, d, a, 15, 22, T16);
#undef SET

     /* Round 2. */
     /* Let [abcd k s i] denote the operation
          a = b + ((a + G(b,c,d) + X[k] + T[i]) <<< s). */
#define G(x, y, z) (((x) & (z)) | ((y) & ~(z)))
#define SET(a, b, c, d, k, s, Ti)\
  t = a + G(b,c,d) + X[k] + Ti;\
  a = ROTATE_LEFT(t, s) + b
     /* Do the following 16 operations. */
    SET(a, b, c, d,  1,  5, T17);
    SET(d, a, b, c,  6,  9, T18);
    SET(c, d, a, b, 11, 14, T19);
    SET(b, c, d, a,  0, 20, T20);
    SET(a, b, c, d,  5,  5, T21);
    SET(d, a, b, c, 10,  9, T22);
    SET(c, d, a, b, 15, 14, T23);
    SET(b, c, d, a,  4, 20, T24);
    SET(a, b, c, d,  9,  5, T25);
    SET(d, a, b, c, 14,  9, T26);
    SET(c, d, a, b,  3, 14, T27);
    SET(b, c, d, a,  8, 20, T28);
    SET(a, b, c, d, 13,  5, T29);
    SET(d, a, b, c,  2,  9, T30);
    SET(c, d, a, b,  7, 14, T31);
    SET(b, c, d, a, 12, 20, T32);
#undef SET

     /* Round 3. */
     /* Let [abcd k s t] denote the operation
          a = b + ((a + H(b,c,d) + X[k] + T[i]) <<< s). */
#define H(x, y, z) ((x) ^ (y) ^ (z))
#define SET(a, b, c, d, k, s, Ti)\
  t = a + H(b,c,d) + X[k] + Ti;\
  a = ROTATE_LEFT(t, s) + b
     /* Do the following 16 operations. */
    SET(a, b, c, d,  5,  4, T33);
    SET(d, a, b, c,  8, 11, T34);
    SET(c, d, a, b, 11, 16, T35);
    SET(b, c, d, a, 14, 23, T36);
    SET(a, b, c, d,  1,  4, T37);
    SET(d, a, b, c,  4, 11, T38);
    SET(c, d, a, b,  7, 16, T39);
    SET(b, c, d, a, 10, 23, T40);
    SET(a, b, c, d, 13,  4, T41);
    SET(d, a, b, c,  0, 11, T42);
    SET(c, d, a, b,  3, 16, T43);
    SET(b, c, d, a,  6, 23, T44);
    SET(a, b, c, d,  9,  4, T45);
    SET(d, a, b, c, 12, 11, T46);
    SET(c, d, a, b, 15, 16, T47);
    SET(b, c, d, a,  2, 23, T48);
#undef SET

     /* Round 4. */
     /* Let [abcd k s t] denote the operation
          a = b + ((a + I(b,c,d) + X[k] + T[i]) <<< s). */
#define I(x, y, z) ((y) ^ ((x) | ~(z)))
#define SET(a, b, c, d, k, s, Ti)\
  t = a + I(b,c,d) + X[k] + Ti;\
  a = ROTATE_LEFT(t, s) + b
     /* Do the following 16 operations. */
    SET(a, b, c, d,  0,  6, T49);
    SET(d, a, b, c,  7, 10, T50);
    SET(c, d, a, b, 14, 15, T51);
    SET(b, c, d, a,  5, 21, T52);
    SET(a, b, c, d, 12,  6, T53);
    SET(d, a, b, c,  3, 10, T54);
    SET(c, d, a, b, 10, 15, T55);
    SET(b, c, d, a,  1, 21, T56);
    SET(a, b, c, d,  8,  6, T57);
    SET(d, a, b, c, 15, 10, T58);
    SET(c, d, a, b,  6, 15, T59);
    SET(b, c, d, a, 13, 21, T60);
    SET(a, b, c, d,  4,  6, T61);
    SET(d, a, b, c, 11, 10, T62);
    SET(c, d, a, b,  2, 15, T63);
    SET(b, c, d, a,  9, 21, T64);
#undef SET

     /* Then perform the following additions. (That is increment each
        of the four registers by the value it had before this block
        was started.) */
    pms->abcd[0] += a;
    pms->abcd[1] += b;
    pms->abcd[2] += c;
    pms->abcd[3] += d;
}